

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * linearize_expression(Proc *proc,AstNode *expr)

{
  int iVar1;
  UnaryOperatorType op;
  BinaryOperatorType op_00;
  C_MemoryAllocator *pCVar2;
  int i;
  int iVar3;
  uint uVar4;
  Instruction *pIVar5;
  void *pvVar6;
  Constant *pCVar7;
  Pseudo *pPVar8;
  AstNode *pAVar9;
  Pseudo *pPVar10;
  Pseudo *pPVar11;
  AstNode *pAVar12;
  AstNode *expr_00;
  ulong uVar13;
  LinearizerState *pLVar14;
  ulong extraout_RAX;
  char *pcVar15;
  ravitype_t rVar16;
  ravitype_t rVar17;
  _Bool is_and;
  opcode targetop;
  char *__format;
  opcode oVar18;
  ravitype_t rVar19;
  char *__s;
  ulong uStackY_e0;
  Pseudo *local_c8;
  Pseudo *local_c0;
  int local_a4;
  PtrListIterator local_98 [4];
  
  switch(expr->type) {
  case EXPR_LITERAL:
    rVar16 = (expr->field_2).common_expr.type.type_code;
    uVar13 = (ulong)(uint)rVar16;
    if (rVar16 == RAVI_TNIL) {
      pCVar2 = proc->linearizer->compiler_state->allocator;
      local_c0 = (Pseudo *)(*pCVar2->calloc)(pCVar2->arena,1,0x30);
      uVar4 = 7;
    }
    else {
      if (rVar16 != RAVI_TBOOLEAN) {
        if (((rVar16 != RAVI_TNUMINT) && (rVar16 != RAVI_TNUMFLT)) && (rVar16 != RAVI_TSTRING)) {
          do {
            if ((int)uVar13 == 0x1000) {
              __s = "Var args not supported";
              pLVar14 = proc->linearizer;
LAB_00117fd4:
              handle_error(pLVar14->compiler_state,__s);
switchD_001174b3_caseD_13:
              pLVar14 = proc->linearizer;
            }
            else {
              pLVar14 = proc->linearizer;
            }
            handle_error(pLVar14->compiler_state,"feature not yet implemented");
            uVar13 = extraout_RAX;
          } while( true );
        }
        pCVar7 = allocate_constant(proc,expr);
        local_c0 = allocate_constant_pseudo(proc,pCVar7);
        break;
      }
      pAVar9 = (expr->field_2).function_stmt.function_expr;
      pCVar2 = proc->linearizer->compiler_state->allocator;
      local_c0 = (Pseudo *)(*pCVar2->calloc)(pCVar2->arena,1,0x30);
      uVar4 = (pAVar9 == (AstNode *)0x0) + 8;
    }
    *(uint *)local_c0 = *(uint *)local_c0 & 0xfffffff0 | uVar4;
    (local_c0->field_3).proc = proc;
    goto LAB_001179bf;
  case EXPR_SYMBOL:
    local_c0 = linearize_symbol_expression(proc,expr);
    break;
  case EXPR_Y_INDEX:
  case EXPR_FIELD_SELECTOR:
    local_c0 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    break;
  default:
    goto switchD_001174b3_caseD_13;
  case EXPR_SUFFIXED:
    local_c0 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    pAVar9 = (expr->field_2).function_stmt.function_expr;
    raviX_ptrlist_forward_iterator(local_98,(PtrList *)(expr->field_2).for_stmt.for_statement_list);
    pAVar12 = (AstNode *)raviX_ptrlist_iter_next(local_98);
    while (expr_00 = pAVar12, expr_00 != (AstNode *)0x0) {
      if ((*(uint *)local_c0 & 0xf) == 0xe) {
        local_c0 = indexed_load(proc,local_c0);
      }
      else if ((*(uint *)local_c0 & 0xf) == 0xb) {
        convert_range_to_temp(local_c0);
      }
      if (expr_00->type - EXPR_Y_INDEX < 2) {
        pPVar8 = linearize_expression(proc,(expr_00->field_2).function_stmt.function_expr);
        rVar16 = ((expr_00->field_2).function_call_expr.method_name)->hash;
        if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
          pPVar8 = indexed_load(proc,pPVar8);
        }
        local_c0 = create_indexed_pseudo
                             (proc,(pAVar9->field_2).common_expr.type.type_code,local_c0,rVar16,
                              pPVar8,(expr_00->field_2).common_expr.type.type_code,expr->line_number
                             );
      }
      else {
        if (expr_00->type != EXPR_FUNCTION_CALL) {
          pLVar14 = proc->linearizer;
          __s = "Unexpected expr type in suffix list";
          goto LAB_00117fd4;
        }
        local_c0 = linearize_function_call_expression(proc,expr_00,pAVar9,local_c0);
      }
      pAVar12 = (AstNode *)raviX_ptrlist_iter_next(local_98);
      pAVar9 = expr_00;
    }
    break;
  case EXPR_UNARY:
    op = (expr->field_2).unary_expr.unary_op;
    rVar16 = ((expr->field_2).function_call_expr.method_name)->hash;
    if (op - UNOPR_MINUS < 4) {
      if (op - UNOPR_BNOT < 2) {
        rVar19 = RAVI_TANY;
LAB_00117a69:
        local_c8 = allocate_temp_pseudo(proc,rVar19,true);
        goto LAB_00117a77;
      }
      if (op == UNOPR_LEN) {
        local_c8 = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
        local_c0 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
        goto LAB_00117c02;
      }
      if (op != UNOPR_MINUS) goto LAB_00117a59;
      local_c8 = allocate_temp_pseudo(proc,rVar16,true);
      local_c0 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
LAB_00117aac:
      oVar18 = op_unmi;
      if (rVar16 != RAVI_TNUMINT) {
        oVar18 = (rVar16 == RAVI_TNUMFLT) + 0x2b + (uint)(rVar16 == RAVI_TNUMFLT);
      }
    }
    else {
      if ((op == UNOPR_TO_INTEGER && rVar16 != RAVI_TNUMINT) ||
         (op == UNOPR_TO_NUMBER && rVar16 != RAVI_TNUMFLT)) {
LAB_00117a59:
        rVar19 = (uint)(op != UNOPR_TO_INTEGER) * 8 + RAVI_TNUMINT;
        goto LAB_00117a69;
      }
      local_c8 = (Pseudo *)0x0;
LAB_00117a77:
      local_c0 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
      switch(op - UNOPR_MINUS) {
      case 0:
        goto LAB_00117aac;
      case 1:
        oVar18 = op_bnot;
        break;
      case 2:
        oVar18 = op_not;
        break;
      case 3:
LAB_00117c02:
        oVar18 = ((rVar16 + ~(RAVI_TNUMBER|RAVI_TBOOLEAN) & 0xffffffdfU) == 0) + op_len;
        break;
      case 4:
        if (rVar16 == RAVI_TNUMINT) goto LAB_001179b6;
        oVar18 = op_toint;
        break;
      case 5:
        if (rVar16 == RAVI_TNUMFLT) goto LAB_001179b6;
        oVar18 = op_toflt;
        break;
      case 6:
        if (rVar16 == RAVI_TARRAYINT) goto LAB_001179b6;
        oVar18 = op_toiarray;
        break;
      case 7:
        if (rVar16 == RAVI_TARRAYFLT) goto LAB_001179b6;
        oVar18 = op_tofarray;
        break;
      case 8:
        if (rVar16 == RAVI_TTABLE) goto LAB_001179b6;
        oVar18 = op_totable;
        break;
      case 9:
        if (rVar16 == RAVI_TSTRING) goto LAB_001179b6;
        oVar18 = op_tostring;
        break;
      case 10:
        if (rVar16 == RAVI_TFUNCTION) goto LAB_001179b6;
        oVar18 = op_toclosure;
        break;
      case 0xb:
        oVar18 = op_totype;
        break;
      default:
        pcVar15 = raviX_get_unary_opr_str(op);
        __format = "unexpected unary op %s";
LAB_00118052:
        __s = (char *)local_98;
        snprintf(__s,100,__format,pcVar15);
        pLVar14 = proc->linearizer;
        goto LAB_00117fd4;
      }
    }
    pIVar5 = allocate_instruction(proc,oVar18,expr->line_number);
    if (op == UNOPR_TO_TYPE) {
      pCVar7 = allocate_string_constant(proc,(expr->field_2).goto_stmt.name);
      pPVar8 = allocate_constant_pseudo(proc,pCVar7);
      pPVar8 = add_instruction_operand(proc,pIVar5,pPVar8);
      if (pPVar8 != (Pseudo *)0x0) {
        __assert_fail("!tofree1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x35b,"Pseudo *linearize_unary_operator(Proc *, AstNode *)");
      }
LAB_00117cfb:
      pPVar8 = (Pseudo *)0x0;
    }
    else {
      if (((1 < op - UNOPR_BNOT) && (op != UNOPR_LEN)) && (op != UNOPR_MINUS)) goto LAB_00117cfb;
      pPVar8 = add_instruction_operand(proc,pIVar5,local_c0);
      free_temp_pseudo(proc,local_c0,false);
      local_c0 = local_c8;
    }
    if (((undefined1  [48])*local_c0 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      local_c0 = indexed_load(proc,local_c0);
    }
    add_instruction_target(proc,pIVar5,local_c0);
    add_instruction(proc,pIVar5);
    if (pPVar8 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar8,false);
    }
    if ((oVar18 & ~op_ret) == op_toint) {
      pIVar5 = allocate_instruction(proc,op_mov,expr->line_number);
      pPVar8 = add_instruction_operand(proc,pIVar5,local_c0);
      free_temp_pseudo(proc,local_c0,false);
      add_instruction_target(proc,pIVar5,local_c8);
      add_instruction(proc,pIVar5);
      local_c0 = local_c8;
      if (pPVar8 != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pPVar8,false);
      }
    }
    break;
  case EXPR_BINARY:
    op_00 = (expr->field_2).binary_expr.binary_op;
    if (op_00 == BINOPR_OR) {
      is_and = false;
LAB_001179ae:
      local_c0 = linearize_bool(proc,expr,is_and);
      break;
    }
    if (op_00 == BINOPR_AND) {
      is_and = true;
      goto LAB_001179ae;
    }
    rVar16 = (expr->field_2).common_expr.type.type_code;
    if (op_00 == BINOPR_NE) {
      local_c8 = allocate_temp_pseudo(proc,rVar16,true);
    }
    else {
      local_c8 = (Pseudo *)0x0;
    }
    local_c0 = allocate_temp_pseudo(proc,rVar16,true);
    pAVar9 = (expr->field_2).function_stmt.function_expr;
    pAVar12 = (expr->field_2).binary_expr.expr_right;
    pPVar10 = linearize_expression(proc,pAVar9);
    pPVar11 = linearize_expression(proc,pAVar12);
    pPVar8 = pPVar11;
    switch(op_00) {
    case BINOPR_ADD:
      uStackY_e0 = 2;
      goto LAB_00117e2a;
    case BINOPR_SUB:
      uStackY_e0 = 6;
      break;
    case BINOPR_MUL:
      uStackY_e0 = 0xb;
LAB_00117e2a:
      rVar17 = (pAVar9->field_2).common_expr.type.type_code;
      rVar19 = (pAVar12->field_2).common_expr.type.type_code;
      if (rVar19 == RAVI_TNUMFLT && rVar17 == RAVI_TNUMINT) {
        rVar19 = RAVI_TNUMFLT;
        rVar16 = RAVI_TNUMINT;
LAB_00117e4e:
        pPVar8 = pPVar10;
        pPVar10 = pPVar11;
        rVar17 = rVar19;
        rVar19 = rVar16;
      }
      goto LAB_00117e81;
    case BINOPR_MOD:
      uStackY_e0 = 0x28;
      break;
    case BINOPR_POW:
      uStackY_e0 = 0x29;
      break;
    case BINOPR_DIV:
      uStackY_e0 = 0xf;
      break;
    case BINOPR_IDIV:
      uStackY_e0 = 0x14;
      break;
    case BINOPR_BAND:
      uStackY_e0 = 0x15;
      break;
    case BINOPR_BOR:
      uStackY_e0 = 0x17;
      break;
    case BINOPR_BXOR:
      uStackY_e0 = 0x19;
      break;
    case BINOPR_SHL:
      uStackY_e0 = 0x1b;
      break;
    case BINOPR_SHR:
      uStackY_e0 = 0x1d;
      break;
    case BINOPR_CONCAT:
      uStackY_e0 = 0x5c;
      break;
    case BINOPR_EQ:
    case BINOPR_NE:
      uStackY_e0 = 0x1f;
      break;
    case BINOPR_LT:
    case BINOPR_GT:
      uStackY_e0 = 0x22;
      goto LAB_00117c7e;
    case BINOPR_LE:
    case BINOPR_GE:
      uStackY_e0 = 0x25;
LAB_00117c7e:
      rVar16 = (pAVar9->field_2).common_expr.type.type_code;
      rVar19 = (pAVar12->field_2).common_expr.type.type_code;
      rVar17 = rVar16;
      if (op_00 - BINOPR_GT < 2) goto LAB_00117e4e;
      goto LAB_00117e81;
    default:
      pcVar15 = raviX_get_binary_opr_str(op_00);
      __format = "unexpected binary op %s";
      goto LAB_00118052;
    }
    rVar17 = (pAVar9->field_2).common_expr.type.type_code;
    rVar19 = (pAVar12->field_2).common_expr.type.type_code;
LAB_00117e81:
    oVar18 = (opcode)uStackY_e0;
    if (oVar18 < op_leii) {
      if ((0x2aa00000UL >> (uStackY_e0 & 0x3f) & 1) == 0) {
        if ((0x2480000000U >> (uStackY_e0 & 0x3f) & 1) == 0) {
          if (uStackY_e0 != 0xf) goto LAB_00117ed9;
          goto LAB_00117f12;
        }
        if ((rVar17 == RAVI_TNUMINT) && (rVar19 == RAVI_TNUMINT)) goto LAB_00117f1d;
        rVar17 = rVar17 ^ RAVI_TNUMFLT;
        rVar19 = rVar19 ^ RAVI_TNUMFLT;
        targetop = oVar18 + op_add;
LAB_00117ece:
        rVar19 = rVar19 | rVar17;
LAB_00117f0b:
        if (rVar19 != ~RAVI_TANY) {
          targetop = oVar18;
        }
      }
      else {
        targetop = oVar18 + (rVar19 == RAVI_TNUMINT && rVar17 == RAVI_TNUMINT);
      }
    }
    else {
LAB_00117ed9:
      if (oVar18 == op_mul) {
LAB_00117ee8:
        if ((rVar17 == RAVI_TNUMFLT) && (rVar19 == RAVI_TNUMFLT)) {
LAB_00117f1d:
          targetop = oVar18 + op_ret;
          goto LAB_00117f2f;
        }
        if ((rVar17 != RAVI_TNUMFLT) || (rVar19 != RAVI_TNUMINT)) {
          targetop = oVar18 + op_addff;
          rVar19 = rVar17 ^ RAVI_TNUMINT | rVar19 ^ RAVI_TNUMINT;
          goto LAB_00117f0b;
        }
      }
      else {
        if (oVar18 != op_sub) {
          targetop = oVar18;
          if (oVar18 != op_add) goto LAB_00117f2f;
          goto LAB_00117ee8;
        }
LAB_00117f12:
        if ((rVar17 == RAVI_TNUMFLT) && (rVar19 == RAVI_TNUMFLT)) goto LAB_00117f1d;
        if ((rVar17 != RAVI_TNUMFLT) || (rVar19 != RAVI_TNUMINT)) {
          if ((rVar17 != RAVI_TNUMINT) || (rVar19 != RAVI_TNUMFLT)) {
            rVar17 = rVar17 ^ RAVI_TNUMINT;
            rVar19 = rVar19 ^ RAVI_TNUMINT;
            targetop = oVar18 + op_addfi;
            goto LAB_00117ece;
          }
          targetop = oVar18 + op_addff;
          goto LAB_00117f2f;
        }
      }
      targetop = oVar18 + op_add;
    }
LAB_00117f2f:
    create_binary_instruction(proc,targetop,pPVar10,pPVar8,local_c0,expr->line_number);
    free_temp_pseudo(proc,pPVar10,false);
    free_temp_pseudo(proc,pPVar8,false);
    if (op_00 == BINOPR_NE) {
      linearize_negate_condition(proc,expr->line_number,local_c0,local_c8);
      local_c0 = local_c8;
    }
    break;
  case EXPR_FUNCTION:
    local_c0 = linearize_function_expr(proc,expr);
    break;
  case EXPR_TABLE_LITERAL:
    i = 1;
    pPVar8 = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
    rVar16 = (expr->field_2).common_expr.type.type_code;
    oVar18 = op_newiarray;
    if (rVar16 != RAVI_TARRAYINT) {
      oVar18 = (rVar16 == RAVI_TARRAYFLT) + 0x3b + (uint)(rVar16 == RAVI_TARRAYFLT);
    }
    pIVar5 = allocate_instruction(proc,oVar18,expr->line_number);
    add_instruction_target(proc,pIVar5,pPVar8);
    add_instruction(proc,pIVar5);
    iVar3 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
    raviX_ptrlist_forward_iterator(local_98,(PtrList *)(expr->field_2).function_stmt.function_expr);
    while( true ) {
      iVar3 = iVar3 + -1;
      pvVar6 = raviX_ptrlist_iter_next(local_98);
      local_c0 = pPVar8;
      if (pvVar6 == (void *)0x0) break;
      rVar16 = (expr->field_2).common_expr.type.type_code;
      pAVar9 = *(AstNode **)((long)pvVar6 + 0x20);
      if (pAVar9 == (AstNode *)0x0) {
        pCVar7 = allocate_integer_constant(proc,i);
        local_c0 = allocate_constant_pseudo(proc,pCVar7);
        local_a4 = 8;
        i = i + 1;
      }
      else {
        local_c0 = linearize_expression(proc,pAVar9);
        local_a4 = *(int *)(*(long *)(*(long *)((long)pvVar6 + 0x20) + 0x20) + 8);
      }
      pPVar10 = linearize_expression(proc,*(AstNode **)((long)pvVar6 + 0x28));
      if ((((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) == (undefined1  [48])0xb) &&
         (iVar3 != 0 || pAVar9 != (AstNode *)0x0)) {
        convert_range_to_temp(pPVar10);
      }
      iVar1 = *(int *)(*(long *)((long)pvVar6 + 0x28) + 8);
      if (rVar16 == RAVI_TARRAYFLT) {
        oVar18 = iVar1 == 0x10 | op_faput;
      }
      else if (rVar16 == RAVI_TARRAYINT) {
        oVar18 = iVar1 == 8 | op_iaput;
      }
      else {
        iVar1 = (uint)(rVar16 == RAVI_TTABLE) * 3;
        oVar18 = iVar1 + op_put;
        if (local_a4 == 0x101) {
          oVar18 = iVar1 + op_put_skey;
        }
        else if (local_a4 == 8) {
          oVar18 = iVar1 + op_put_ikey;
        }
      }
      pIVar5 = allocate_instruction(proc,oVar18,*(uint *)((long)pvVar6 + 4));
      add_instruction_target(proc,pIVar5,pPVar8);
      add_instruction_target(proc,pIVar5,local_c0);
      pPVar11 = add_instruction_operand(proc,pIVar5,pPVar10);
      add_instruction(proc,pIVar5);
      if (pPVar11 != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pPVar11,false);
      }
      free_temp_pseudo(proc,local_c0,false);
      free_temp_pseudo(proc,pPVar10,false);
    }
    break;
  case EXPR_CONCAT:
    local_c0 = linearize_concat_expression(proc,expr);
    break;
  case EXPR_BUILTIN:
    if ((expr->field_2).unary_expr.unary_op != 0x111) goto switchD_001174b3_caseD_13;
    pIVar5 = allocate_instruction(proc,op_C__new,expr->line_number);
    local_c0 = allocate_temp_pseudo(proc,RAVI_TUSERDATA,true);
    pvVar6 = raviX_ptrlist_nth_entry((PtrList *)(expr->field_2).function_stmt.function_expr,0);
    pCVar7 = allocate_string_constant(proc,*(StringObject **)((long)pvVar6 + 0x20));
    pPVar8 = allocate_constant_pseudo(proc,pCVar7);
    pPVar8 = add_instruction_operand(proc,pIVar5,pPVar8);
    pAVar9 = (AstNode *)
             raviX_ptrlist_nth_entry((PtrList *)(expr->field_2).function_stmt.function_expr,1);
    pPVar10 = linearize_expression(proc,pAVar9);
    pPVar11 = add_instruction_operand(proc,pIVar5,pPVar10);
    add_instruction_target(proc,pIVar5,local_c0);
    add_instruction(proc,pIVar5);
    free_temp_pseudo(proc,pPVar10,false);
    if (pPVar8 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar8,false);
    }
    if (pPVar11 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar11,false);
    }
  }
LAB_001179b6:
  if (local_c0 == (Pseudo *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x7e3,"Pseudo *linearize_expression(Proc *, AstNode *)");
  }
LAB_001179bf:
  check_pseudo_is_top(proc,local_c0);
  if ((((undefined1  [48])*local_c0 & (undefined1  [48])0xf) == (undefined1  [48])0xb) &&
     (((expr->field_2).embedded_C_stmt.is_decl & 1U) != 0)) {
    convert_range_to_temp(local_c0);
  }
  return local_c0;
}

Assistant:

static Pseudo *linearize_expression(Proc *proc, AstNode *expr)
{
	Pseudo *result = NULL;
	switch (expr->type) {
	case EXPR_LITERAL: {
		result = linearize_literal(proc, expr);
	} break;
	case EXPR_BINARY: {
		result = linearize_binary_operator(proc, expr);
	} break;
	case EXPR_FUNCTION: {
		result = linearize_function_expr(proc, expr);
	} break;
	case EXPR_UNARY: {
		result = linearize_unary_operator(proc, expr);
	} break;
	case EXPR_SUFFIXED: {
		result = linearize_suffixedexpr(proc, expr);
	} break;
	case EXPR_SYMBOL: {
		result = linearize_symbol_expression(proc, expr);
	} break;
	case EXPR_TABLE_LITERAL: {
		result = linearize_table_constructor(proc, expr);
	} break;
	case EXPR_Y_INDEX:
	case EXPR_FIELD_SELECTOR: {
		result = linearize_expression(proc, expr->index_expr.expr);
	} break;
	case EXPR_CONCAT: {
		result = linearize_concat_expression(proc, expr);
	} break;
	case EXPR_BUILTIN: {
		result = linearize_builtin_expression(proc, expr);
	} break;
	default:
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		break;
	}
	assert(result);
	check_pseudo_is_top(proc, result);
	if (result->type == PSEUDO_RANGE && expr->common_expr.truncate_results) {
		// Need to truncate the results to 1
		return convert_range_to_temp(result);
	}
	return result;
}